

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::OnNewSnapshot(CGameClient *this)

{
  uint uVar1;
  long lVar2;
  CNetObj_PlayerInfo *pCVar3;
  undefined8 uVar4;
  vec2 Pos;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int b;
  IClient *pIVar9;
  CConfig *pCVar10;
  char *pcVar11;
  IConsole *pIVar12;
  CClientData *__src;
  bool *pbVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IDemoPlayer *pIVar14;
  ulong uVar15;
  CNetObj_PlayerInfo **ppCVar16;
  CNetObj_PlayerInfo **ppCVar17;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffda38;
  uint in_stack_ffffffffffffda3c;
  int in_stack_ffffffffffffda40;
  int in_stack_ffffffffffffda44;
  undefined4 in_stack_ffffffffffffda48;
  int in_stack_ffffffffffffda4c;
  CGameClient *in_stack_ffffffffffffda50;
  code *pcVar18;
  CClientData *in_stack_ffffffffffffda58;
  undefined4 in_stack_ffffffffffffda60;
  int in_stack_ffffffffffffda64;
  CStats *in_stack_ffffffffffffda68;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffda78;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffda7c;
  int i_4;
  int i_3;
  int i_2;
  int k;
  FCompareFunc Compare;
  CCharacterInfo *c;
  int GameFlags;
  int EvolveCurTick;
  int EvolvePrevTick;
  void *pOld;
  CCharacterInfo *pCharInfo;
  int ClientID_2;
  CNetObj_PlayerInfoRace *pInfo_4;
  int ClientID_1;
  CNetObj_PlayerInfo *pInfo_3;
  CNetObj_De_TuneParams *pInfo_2;
  CNetObj_De_GameInfo *pInfo_1;
  int p;
  CClientData *pClient;
  int ClientID;
  CNetObj_De_ClientInfo *pInfo;
  void *pData_1;
  int i_1;
  int Num_1;
  int i;
  int MsgLen;
  void *pData;
  int Index;
  int Num;
  CGameClient *this_local;
  CPlayerInfoItem Tmp;
  vec2 local_248c;
  vector2_base<float> local_2484;
  CSnapItem Item_1;
  CTuningParams StandardTuning;
  CNetMsg_Cl_Say Msg;
  CSnapItem Item;
  CServerInfo CurrentServerInfo;
  char aMessage [64];
  char aBuf [256];
  undefined4 extraout_var;
  
  CurrentServerInfo.m_aClients[0x23].m_aName[0x3c] = '\0';
  CurrentServerInfo.m_aClients[0x23].m_aName[0x3d] = '\0';
  CurrentServerInfo.m_aClients[0x23].m_aName[0x3e] = '\0';
  CurrentServerInfo.m_aClients[0x23].m_aName[0x3f] = '\0';
  CurrentServerInfo.m_aClients[0x23].m_aName[0x40] = '\0';
  CurrentServerInfo.m_aClients[0x23].m_aClan[0] = '\0';
  CurrentServerInfo.m_aClients[0x23].m_aClan[1] = '\0';
  CurrentServerInfo.m_aClients[0x23].m_aClan[2] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x38] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x39] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x3a] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x3b] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x3c] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x3d] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x3e] = '\0';
  CurrentServerInfo.m_aClients[4].m_aName[0x3f] = '\0';
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero((void *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
           in_stack_ffffffffffffda3c);
  pIVar9 = Client(this);
  iVar5 = (*(pIVar9->super_IInterface)._vptr_IInterface[0x1e])(pIVar9,0);
  for (Index = 0; Index < iVar5; Index = Index + 1) {
    pIVar9 = Client(this);
    (*(pIVar9->super_IInterface)._vptr_IInterface[0x20])(pIVar9,0,(ulong)(uint)Index,&Item);
    iVar6 = CNetObjHandler::ValidateObj((CNetObjHandler *)pClient,p,pInfo_1,pInfo_2._4_4_);
    if (iVar6 != 0) {
      pCVar10 = Config(this);
      iVar6 = Item.m_Type;
      if (pCVar10->m_Debug != 0) {
        pcVar11 = CNetObjHandler::GetObjName(&this->m_NetObjHandler,Item.m_Type);
        in_stack_ffffffffffffda38 = Item.m_DataSize;
        in_stack_ffffffffffffda40 = Item.m_ID;
        str_format(aBuf,0x100,"invalidated index=%d type=%d (%s) size=%d id=%d",(ulong)(uint)Index,
                   (ulong)(uint)iVar6,pcVar11);
        pIVar12 = Console(this);
        (*(pIVar12->super_IInterface)._vptr_IInterface[0x19])(pIVar12,2,"game",aBuf,0);
      }
      pIVar9 = Client(this);
      (*(pIVar9->super_IInterface)._vptr_IInterface[0x21])(pIVar9,0,(ulong)(uint)Index);
    }
  }
  ProcessEvents((CGameClient *)c);
  pCVar10 = Config(this);
  if (pCVar10->m_DbgStress != 0) {
    pIVar9 = Client(this);
    iVar5 = IClient::GameTick(pIVar9);
    if (iVar5 % 100 == 0) {
      iVar5 = random_int();
      iVar5 = (int)((ulong)(long)iVar5 % 0x3f);
      for (i = 0; i < iVar5; i = i + 1) {
        iVar6 = random_int();
        aMessage[i] = (char)(iVar6 % 0x19) + 'a';
      }
      aMessage[iVar5] = '\0';
      random_int();
      Client(this);
      IClient::SendPackMsg<CNetMsg_Cl_Say>
                ((IClient *)in_stack_ffffffffffffda58,(CNetMsg_Cl_Say *)in_stack_ffffffffffffda50,
                 in_stack_ffffffffffffda4c);
    }
  }
  CTuningParams::CTuningParams
            ((CTuningParams *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40));
  pIVar9 = Client(this);
  iVar5 = IClient::State(pIVar9);
  if (iVar5 == 4) {
    memcpy(&this->m_Tuning,&StandardTuning,0x80);
    mem_zero((void *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
             in_stack_ffffffffffffda3c);
  }
  pIVar9 = Client(this);
  iVar5 = (*(pIVar9->super_IInterface)._vptr_IInterface[0x1e])(pIVar9,0);
  for (i_1 = 0; i_1 < iVar5; i_1 = i_1 + 1) {
    pIVar9 = Client(this);
    iVar6 = (*(pIVar9->super_IInterface)._vptr_IInterface[0x20])(pIVar9,0,(ulong)(uint)i_1,&Item_1);
    __src = (CClientData *)CONCAT44(extraout_var,iVar6);
    pIVar9 = Client(this);
    iVar6 = IClient::State(pIVar9);
    if (iVar6 == 4) {
      if (Item_1.m_Type == 0xd) {
        if (Item_1.m_ID < 0x40) {
          pcVar11 = this->m_aClients[Item_1.m_ID].m_aName;
          if (*(int *)&((IInterface *)__src->m_aName)->_vptr_IInterface != 0) {
            this->m_LocalClientID = Item_1.m_ID;
          }
          pcVar11[0x5ac] = true;
          *(int *)(pcVar11 + 0x308) =
               *(int *)((long)&((IInterface *)__src->m_aName)->_vptr_IInterface + 4);
          IntsToStr((int *)&((IInterface *)__src->m_aName)->m_pKernel,4,pcVar11);
          IntsToStr((int *)((long)((IInterface *)__src->m_aName + 1) + 8),3,pcVar11 + 0x41);
          *(int *)(pcVar11 + 0x74) = *(int *)((long)((IInterface *)__src->m_aName + 2) + 4);
          for (p = 0; p < 6; p = p + 1) {
            IntsToStr((int *)(__src->m_aClan + (long)p * 0x18 + -0x19),6,
                      pcVar11 + (long)p * 0x61 + 0x78);
            *(undefined4 *)(pcVar11 + (long)p * 4 + 0x2c0) =
                 *(undefined4 *)(__src->m_aaSkinPartNames[0] + (long)p * 4 + 0x40);
            *(undefined4 *)(pcVar11 + (long)p * 4 + 0x2d8) =
                 *(undefined4 *)(__src->m_aaSkinPartNames[0] + (long)p * 4 + 0x58);
          }
          (this->m_GameInfo).m_NumPlayers = (this->m_GameInfo).m_NumPlayers + 1;
          if (*(int *)(pcVar11 + 0x308) != -1) {
            (this->m_GameInfo).m_aTeamSize[*(int *)(pcVar11 + 0x308)] =
                 (this->m_GameInfo).m_aTeamSize[*(int *)(pcVar11 + 0x308)] + 1;
          }
        }
      }
      else if (Item_1.m_Type == 0xe) {
        (this->m_GameInfo).m_GameFlags = *(int *)&((IInterface *)__src->m_aName)->_vptr_IInterface;
        (this->m_GameInfo).m_ScoreLimit =
             *(int *)((long)&((IInterface *)__src->m_aName)->_vptr_IInterface + 4);
        (this->m_GameInfo).m_TimeLimit = *(int *)&((IInterface *)__src->m_aName)->m_pKernel;
        (this->m_GameInfo).m_MatchNum =
             *(int *)((long)&((IInterface *)__src->m_aName)->m_pKernel + 4);
        (this->m_GameInfo).m_MatchCurrent = *(int *)((IInterface *)__src->m_aName + 1);
      }
      else if (Item_1.m_Type == 0xf) {
        mem_copy((void *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                 (void *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38),0);
        this->m_ServerMode = 0;
      }
    }
    if (Item_1.m_Type == 0xb) {
      if ((Item_1.m_ID < 0x40) && ((this->m_aClients[Item_1.m_ID].m_Active & 1U) != 0)) {
        (this->m_Snap).m_paPlayerInfos[Item_1.m_ID] = (CNetObj_PlayerInfo *)__src;
        (this->m_Snap).m_aInfoByScore[Item_1.m_ID].m_pPlayerInfo = (CNetObj_PlayerInfo *)__src;
        (this->m_Snap).m_aInfoByScore[Item_1.m_ID].m_ClientID = Item_1.m_ID;
        if ((this->m_LocalClientID == Item_1.m_ID) &&
           ((this->m_Snap).m_pLocalInfo = (CNetObj_PlayerInfo *)__src,
           this->m_aClients[Item_1.m_ID].m_Team == -1)) {
          (this->m_Snap).m_SpecInfo.m_Active = true;
          (this->m_Snap).m_SpecInfo.m_SpecMode = 0;
          (this->m_Snap).m_SpecInfo.m_SpectatorID = -1;
        }
        CClientData::UpdateBotRenderInfo
                  (in_stack_ffffffffffffda58,in_stack_ffffffffffffda50,in_stack_ffffffffffffda4c);
      }
    }
    else if (Item_1.m_Type == 0x17) {
      if ((Item_1.m_ID < 0x40) && ((this->m_aClients[Item_1.m_ID].m_Active & 1U) != 0)) {
        (this->m_Snap).m_paPlayerInfosRace[Item_1.m_ID] = (CNetObj_PlayerInfoRace *)__src;
      }
    }
    else if (Item_1.m_Type == 10) {
      if (Item_1.m_ID < 0x40) {
        pbVar13 = &(this->m_Snap).m_aCharacters[Item_1.m_ID].m_Active;
        pIVar9 = Client(this);
        iVar6 = (*(pIVar9->super_IInterface)._vptr_IInterface[0x1f])
                          (pIVar9,1,10,(ulong)(uint)Item_1.m_ID);
        memcpy((CNetObj_Character *)(pbVar13 + 0x5c),__src,0x58);
        if (*(int *)(pbVar13 + 0xa4) != 5) {
          iVar7 = clamp<int>(*(int *)(pbVar13 + 0xa0),0,10);
          *(int *)(pbVar13 + 0xa0) = iVar7;
        }
        if ((void *)CONCAT44(extraout_var_00,iVar6) != (void *)0x0) {
          *pbVar13 = true;
          memcpy((CNetObj_Character *)(pbVar13 + 4),(void *)CONCAT44(extraout_var_00,iVar6),0x58);
          in_stack_ffffffffffffda78 =
               (anon_union_4_2_94730284_for_vector2_base<float>_1)
               (((CNetObj_Character *)(pbVar13 + 4))->super_CNetObj_CharacterCore).m_Tick;
          pIVar9 = Client(this);
          iVar6 = IClient::GameTickSpeed(pIVar9);
          in_stack_ffffffffffffda7c.y = in_stack_ffffffffffffda78.x + iVar6 * 3;
          pIVar9 = Client(this);
          iVar6 = IClient::PrevGameTick(pIVar9);
          iVar7 = minimum<int>((int)in_stack_ffffffffffffda7c,iVar6);
          iVar6 = (((CNetObj_Character *)(pbVar13 + 0x5c))->super_CNetObj_CharacterCore).m_Tick;
          pIVar9 = Client(this);
          iVar8 = IClient::GameTickSpeed(pIVar9);
          pIVar9 = Client(this);
          b = IClient::GameTick(pIVar9);
          minimum<int>(iVar6 + iVar8 * 3,b);
          if (this->m_aClients[Item_1.m_ID].m_Evolved.super_CNetObj_CharacterCore.m_Tick == iVar7) {
            memcpy((CNetObj_Character *)(pbVar13 + 4),&this->m_aClients[Item_1.m_ID].m_Evolved,0x58)
            ;
            iVar6 = mem_comp((void *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                             (void *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38),0
                            );
            if (iVar6 == 0) {
              memcpy((CNetObj_Character *)(pbVar13 + 0x5c),&this->m_aClients[Item_1.m_ID].m_Evolved,
                     0x58);
            }
          }
          if ((((CNetObj_Character *)(pbVar13 + 4))->super_CNetObj_CharacterCore).m_Tick != 0) {
            EvolveCharacter((CGameClient *)
                            CONCAT44(in_stack_ffffffffffffda4c,in_stack_ffffffffffffda48),
                            (CNetObj_Character *)
                            CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                            in_stack_ffffffffffffda3c);
          }
          if ((((CNetObj_Character *)(pbVar13 + 0x5c))->super_CNetObj_CharacterCore).m_Tick != 0) {
            EvolveCharacter((CGameClient *)
                            CONCAT44(in_stack_ffffffffffffda4c,in_stack_ffffffffffffda48),
                            (CNetObj_Character *)
                            CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                            in_stack_ffffffffffffda3c);
          }
          memcpy(&this->m_aClients[Item_1.m_ID].m_Evolved,
                 &(this->m_Snap).m_aCharacters[Item_1.m_ID].m_Cur,0x58);
        }
        if (Item_1.m_ID == this->m_LocalClientID) {
          pIVar9 = Client(this);
          iVar6 = IClient::State(pIVar9);
          if (iVar6 != 4) goto LAB_001d01e5;
        }
        vector2_base<float>::vector2_base
                  (&local_2484,(float)*(int *)(pbVar13 + 0x60),(float)*(int *)(pbVar13 + 100));
        Pos.field_1 = in_stack_ffffffffffffda7c;
        Pos.field_0 = in_stack_ffffffffffffda78;
        ProcessTriggeredEvents
                  ((CGameClient *)CONCAT44(in_stack_ffffffffffffda4c,in_stack_ffffffffffffda48),
                   in_stack_ffffffffffffda44,Pos);
      }
    }
    else if (Item_1.m_Type == 0xc) {
      (this->m_Snap).m_pSpectatorInfo = (CNetObj_SpectatorInfo *)__src;
      pIVar9 = Client(this);
      iVar6 = (*(pIVar9->super_IInterface)._vptr_IInterface[0x1f])
                        (pIVar9,1,0xc,(ulong)(uint)Item_1.m_ID);
      (this->m_Snap).m_pPrevSpectatorInfo = (CNetObj_SpectatorInfo *)CONCAT44(extraout_var_01,iVar6)
      ;
      (this->m_Snap).m_SpecInfo.m_Active = true;
      (this->m_Snap).m_SpecInfo.m_SpecMode = ((this->m_Snap).m_pSpectatorInfo)->m_SpecMode;
      (this->m_Snap).m_SpecInfo.m_SpectatorID = ((this->m_Snap).m_pSpectatorInfo)->m_SpectatorID;
    }
    else if (Item_1.m_Type == 6) {
      (this->m_Snap).m_pGameData = (CNetObj_GameData *)__src;
      uVar1 = ((this->m_Snap).m_pGameData)->m_GameStateFlags;
      if (((OnNewSnapshot::s_LastGameFlags & 8U) == 0) && ((uVar1 & 8) != 0)) {
        (*(this->super_IGameClient).super_IInterface._vptr_IInterface[0x18])();
      }
      else if (((OnNewSnapshot::s_LastGameFlags & 8U) != 0) && ((uVar1 & 8) == 0)) {
        (*(this->super_IGameClient).super_IInterface._vptr_IInterface[0x19])();
      }
      if ((((((this->m_Snap).m_pGameData)->m_GameStartTick != this->m_LastGameStartTick) &&
           ((OnNewSnapshot::s_LastGameFlags & 4U) == 0)) &&
          ((OnNewSnapshot::s_LastGameFlags & 0x10U) == 0)) &&
         (((uVar1 & 0x10) == 0 || ((uVar1 & 0x20) != 0)))) {
        CStats::OnMatchStart((CStats *)0x1d0014);
      }
      if ((uVar1 & 0x1c) == 0) {
        in_stack_ffffffffffffda68 = this->m_pStats;
        pIVar9 = Client(this);
        in_stack_ffffffffffffda64 = IClient::GameTick(pIVar9);
        pIVar9 = Client(this);
        iVar6 = IClient::PrevGameTick(pIVar9);
        CStats::UpdatePlayTime(in_stack_ffffffffffffda68,in_stack_ffffffffffffda64 - iVar6);
      }
      OnNewSnapshot::s_LastGameFlags = uVar1;
      this->m_LastGameStartTick = ((this->m_Snap).m_pGameData)->m_GameStartTick;
    }
    else if (Item_1.m_Type == 7) {
      (this->m_Snap).m_pGameDataTeam = (CNetObj_GameDataTeam *)__src;
    }
    else if (Item_1.m_Type == 8) {
      (this->m_Snap).m_pGameDataFlag = (CNetObj_GameDataFlag *)__src;
      (this->m_Snap).m_GameDataFlagSnapID = Item_1.m_ID;
      if ((this->m_LastFlagCarrierRed == -2) &&
         (-1 < ((this->m_Snap).m_pGameDataFlag)->m_FlagCarrierRed)) {
        CStats::OnFlagGrab(this->m_pStats,((this->m_Snap).m_pGameDataFlag)->m_FlagCarrierRed);
      }
      else if ((this->m_LastFlagCarrierBlue == -2) &&
              (-1 < ((this->m_Snap).m_pGameDataFlag)->m_FlagCarrierBlue)) {
        CStats::OnFlagGrab(this->m_pStats,((this->m_Snap).m_pGameDataFlag)->m_FlagCarrierBlue);
      }
      this->m_LastFlagCarrierRed = ((this->m_Snap).m_pGameDataFlag)->m_FlagCarrierRed;
      this->m_LastFlagCarrierBlue = ((this->m_Snap).m_pGameDataFlag)->m_FlagCarrierBlue;
    }
    else if (Item_1.m_Type == 0x18) {
      (this->m_Snap).m_pGameDataRace = (CNetObj_GameDataRace *)__src;
    }
    else if (Item_1.m_Type == 5) {
      (this->m_Snap).m_paFlags[Item_1.m_ID % 2] = (CNetObj_Flag *)__src;
      in_stack_ffffffffffffda58 = __src;
    }
LAB_001d01e5:
  }
  if (this->m_LocalClientID < 0) {
    (this->m_Snap).m_SpecInfo.m_Active = true;
    pIVar9 = Client(this);
    iVar5 = IClient::State(pIVar9);
    if (iVar5 == 4) {
      pIVar14 = DemoPlayer(this);
      iVar5 = (*(pIVar14->super_IInterface)._vptr_IInterface[10])();
      if (((iVar5 == 2) && (this->m_DemoSpecID != -1)) &&
         (((this->m_Snap).m_aCharacters[this->m_DemoSpecID].m_Active & 1U) != 0)) {
        (this->m_Snap).m_SpecInfo.m_SpecMode = 1;
        (this->m_Snap).m_SpecInfo.m_SpectatorID = this->m_DemoSpecID;
        goto LAB_001d03dc;
      }
    }
    if (this->m_DemoSpecMode == 1) {
      (this->m_Snap).m_SpecInfo.m_SpecMode = 0;
      (this->m_Snap).m_SpecInfo.m_SpectatorID = -1;
    }
    else {
      (this->m_Snap).m_SpecInfo.m_SpecMode = this->m_DemoSpecMode;
      (this->m_Snap).m_SpecInfo.m_SpectatorID = this->m_DemoSpecID;
    }
  }
  else {
    pbVar13 = &(this->m_Snap).m_aCharacters[this->m_LocalClientID].m_Active;
    if ((*pbVar13 & 1U) == 0) {
      pIVar9 = Client(this);
      iVar5 = (*(pIVar9->super_IInterface)._vptr_IInterface[0x1f])
                        (pIVar9,1,10,(ulong)(uint)this->m_LocalClientID);
      if (CONCAT44(extraout_var_02,iVar5) != 0) {
        (*(this->m_pControls->super_CComponent)._vptr_CComponent[0xe])();
      }
    }
    else if (((this->m_Snap).m_SpecInfo.m_Active & 1U) == 0) {
      (this->m_Snap).m_pLocalCharacter = (CNetObj_Character *)(pbVar13 + 0x5c);
      (this->m_Snap).m_pLocalPrevCharacter = (CNetObj_Character *)(pbVar13 + 4);
      vector2_base<float>::vector2_base
                (&local_248c,
                 (float)(((this->m_Snap).m_pLocalCharacter)->super_CNetObj_CharacterCore).m_X,
                 (float)(((this->m_Snap).m_pLocalCharacter)->super_CNetObj_CharacterCore).m_Y);
      this->m_LocalCharacterPos = local_248c;
    }
  }
LAB_001d03dc:
  if (((this->m_GameInfo).m_GameFlags & 8U) == 0) {
    pcVar18 = CompareScore;
  }
  else {
    pcVar18 = CompareTime;
  }
  for (k = 0; k < 0x3f; k = k + 1) {
    for (i_2 = 0; i_2 < 0x3f - k; i_2 = i_2 + 1) {
      if (((this->m_Snap).m_aInfoByScore[i_2 + 1].m_pPlayerInfo != (CNetObj_PlayerInfo *)0x0) &&
         (((this->m_Snap).m_aInfoByScore[i_2].m_pPlayerInfo == (CNetObj_PlayerInfo *)0x0 ||
          (uVar15 = (*pcVar18)((this->m_Snap).m_aInfoByScore[i_2].m_pPlayerInfo,
                               (this->m_Snap).m_aInfoByScore[i_2 + 1].m_pPlayerInfo),
          (uVar15 & 1) != 0)))) {
        ppCVar16 = &(this->m_Snap).m_aInfoByScore[i_2].m_pPlayerInfo;
        pCVar3 = *ppCVar16;
        uVar4 = ppCVar16[1];
        ppCVar17 = &(this->m_Snap).m_aInfoByScore[i_2 + 1].m_pPlayerInfo;
        ppCVar16 = &(this->m_Snap).m_aInfoByScore[i_2].m_pPlayerInfo;
        *ppCVar16 = *ppCVar17;
        ppCVar16[1] = ppCVar17[1];
        ppCVar16 = &(this->m_Snap).m_aInfoByScore[i_2 + 1].m_pPlayerInfo;
        *ppCVar16 = pCVar3;
        ppCVar16[1] = (CNetObj_PlayerInfo *)uVar4;
      }
    }
  }
  for (i_3 = 0; i_3 < 0x40; i_3 = i_3 + 1) {
    if ((this->m_Snap).m_paPlayerInfos[i_3] != (CNetObj_PlayerInfo *)0x0) {
      if ((((this->m_Snap).m_pGameData != (CNetObj_GameData *)0x0) &&
          ((((this->m_Snap).m_pGameData)->m_GameStateFlags & 0x31U) != 0)) &&
         ((((this->m_Snap).m_pGameData)->m_GameStateEndTick == 0 &&
          ((this->m_aClients[i_3].m_Team != -1 &&
           (((this->m_Snap).m_paPlayerInfos[i_3]->m_PlayerFlags & 8U) == 0)))))) {
        (this->m_Snap).m_NotReadyCount = (this->m_Snap).m_NotReadyCount + 1;
      }
      if (((((this->m_GameInfo).m_GameFlags & 4U) != 0) && (this->m_aClients[i_3].m_Team != -1)) &&
         (((this->m_Snap).m_paPlayerInfos[i_3]->m_PlayerFlags & 0x10U) == 0)) {
        iVar5 = this->m_aClients[i_3].m_Team;
        (this->m_Snap).m_AliveCount[iVar5] = (this->m_Snap).m_AliveCount[iVar5] + 1;
      }
    }
  }
  pIVar9 = Client(this);
  iVar5 = IClient::State(pIVar9);
  if (iVar5 == 4) {
    for (i_4 = 0; i_4 < 0x40; i_4 = i_4 + 1) {
      if ((this->m_aClients[i_4].m_Active & 1U) != 0) {
        CClientData::UpdateRenderInfo
                  ((CClientData *)in_stack_ffffffffffffda68,
                   (CGameClient *)CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
                   (int)((ulong)in_stack_ffffffffffffda58 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffda58 >> 0x18,0));
      }
    }
  }
  pIVar9 = Client(this);
  (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])(pIVar9,&CurrentServerInfo);
  iVar5 = str_comp((char *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                   (char *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38));
  if (((iVar5 == 0) ||
      (iVar5 = str_comp((char *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                        (char *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38)),
      iVar5 == 0)) ||
     ((iVar5 = str_comp((char *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                        (char *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38)),
      iVar5 == 0 ||
      ((iVar5 = str_comp((char *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                         (char *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38)),
       iVar5 == 0 ||
       (iVar5 = str_comp((char *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                         (char *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38)),
       iVar5 == 0)))))) {
    iVar5 = mem_comp((void *)CONCAT44(in_stack_ffffffffffffda44,in_stack_ffffffffffffda40),
                     (void *)CONCAT44(in_stack_ffffffffffffda3c,in_stack_ffffffffffffda38),0);
    if (iVar5 == 0) {
      this->m_ServerMode = 0;
    }
    else {
      this->m_ServerMode = 2;
    }
  }
  else {
    this->m_ServerMode = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::OnNewSnapshot()
{
	// clear out the invalid pointers
	mem_zero(&m_Snap, sizeof(m_Snap));

	// secure snapshot
	{
		int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
		for(int Index = 0; Index < Num; Index++)
		{
			IClient::CSnapItem Item;
			const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, Index, &Item);
			if(m_NetObjHandler.ValidateObj(Item.m_Type, pData, Item.m_DataSize) != 0)
			{
				if(Config()->m_Debug)
				{
					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "invalidated index=%d type=%d (%s) size=%d id=%d", Index, Item.m_Type, m_NetObjHandler.GetObjName(Item.m_Type), Item.m_DataSize, Item.m_ID);
					Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
				}
				Client()->SnapInvalidateItem(IClient::SNAP_CURRENT, Index);
			}
		}
	}

	ProcessEvents();

	if(Config()->m_DbgStress)
	{
		if((Client()->GameTick()%100) == 0)
		{
			char aMessage[64];
			int MsgLen = random_int()%(sizeof(aMessage)-1);
			for(int i = 0; i < MsgLen; i++)
				aMessage[i] = 'a'+(random_int()%('z'-'a'));
			aMessage[MsgLen] = 0;

			CNetMsg_Cl_Say Msg;
			Msg.m_Mode = random_int()&1;
			Msg.m_Target = -1;
			Msg.m_pMessage = aMessage;
			Client()->SendPackMsg(&Msg, MSGFLAG_VITAL);
		}
	}

	CTuningParams StandardTuning;
	if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_Tuning = StandardTuning;
		mem_zero(&m_GameInfo, sizeof(m_GameInfo));
	}

	// go trough all the items in the snapshot and gather the info we want
	{
		int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
		for(int i = 0; i < Num; i++)
		{
			IClient::CSnapItem Item;
			const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

			// demo items
			if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
			{
				if(Item.m_Type == NETOBJTYPE_DE_CLIENTINFO)
				{
					const CNetObj_De_ClientInfo *pInfo = (const CNetObj_De_ClientInfo *)pData;
					int ClientID = Item.m_ID;
					if(ClientID < MAX_CLIENTS)
					{
						CClientData *pClient = &m_aClients[ClientID];

						if(pInfo->m_Local)
							m_LocalClientID = ClientID;
						pClient->m_Active = true;
						pClient->m_Team  = pInfo->m_Team;
						IntsToStr(pInfo->m_aName, 4, pClient->m_aName);
						IntsToStr(pInfo->m_aClan, 3, pClient->m_aClan);
						pClient->m_Country = pInfo->m_Country;

						for(int p = 0; p < NUM_SKINPARTS; p++)
						{
							IntsToStr(pInfo->m_aaSkinPartNames[p], 6, pClient->m_aaSkinPartNames[p]);
							pClient->m_aUseCustomColors[p] = pInfo->m_aUseCustomColors[p];
							pClient->m_aSkinPartColors[p] = pInfo->m_aSkinPartColors[p];
						}

						m_GameInfo.m_NumPlayers++;
						// calculate team-balance
						if(pClient->m_Team != TEAM_SPECTATORS)
							m_GameInfo.m_aTeamSize[pClient->m_Team]++;
					}
				}
				else if(Item.m_Type == NETOBJTYPE_DE_GAMEINFO)
				{
					const CNetObj_De_GameInfo *pInfo = (const CNetObj_De_GameInfo *)pData;

					m_GameInfo.m_GameFlags = pInfo->m_GameFlags;
					m_GameInfo.m_ScoreLimit = pInfo->m_ScoreLimit;
					m_GameInfo.m_TimeLimit = pInfo->m_TimeLimit;
					m_GameInfo.m_MatchNum = pInfo->m_MatchNum;
					m_GameInfo.m_MatchCurrent = pInfo->m_MatchCurrent;
				}
				else if(Item.m_Type == NETOBJTYPE_DE_TUNEPARAMS)
				{
					const CNetObj_De_TuneParams *pInfo = (const CNetObj_De_TuneParams *)pData;

					mem_copy(&m_Tuning, pInfo->m_aTuneParams, sizeof(m_Tuning));
					m_ServerMode = SERVERMODE_PURE;
				}
			}

			// network items
			if(Item.m_Type == NETOBJTYPE_PLAYERINFO)
			{
				const CNetObj_PlayerInfo *pInfo = (const CNetObj_PlayerInfo *)pData;
				int ClientID = Item.m_ID;
				if(ClientID < MAX_CLIENTS && m_aClients[ClientID].m_Active)
				{
					m_Snap.m_paPlayerInfos[ClientID] = pInfo;
					m_Snap.m_aInfoByScore[ClientID].m_pPlayerInfo = pInfo;
					m_Snap.m_aInfoByScore[ClientID].m_ClientID = ClientID;

					if(m_LocalClientID == ClientID)
					{
						m_Snap.m_pLocalInfo = pInfo;

						if(m_aClients[ClientID].m_Team == TEAM_SPECTATORS)
						{
							m_Snap.m_SpecInfo.m_Active = true;
							m_Snap.m_SpecInfo.m_SpecMode = SPEC_FREEVIEW;
							m_Snap.m_SpecInfo.m_SpectatorID = -1;
						}
					}
					m_aClients[ClientID].UpdateBotRenderInfo(this, ClientID);
				}
			}
			else if(Item.m_Type == NETOBJTYPE_PLAYERINFORACE)
			{
				const CNetObj_PlayerInfoRace *pInfo = (const CNetObj_PlayerInfoRace *)pData;
				int ClientID = Item.m_ID;
				if(ClientID < MAX_CLIENTS && m_aClients[ClientID].m_Active)
				{
					m_Snap.m_paPlayerInfosRace[ClientID] = pInfo;
				}
			}
			else if(Item.m_Type == NETOBJTYPE_CHARACTER)
			{
				if(Item.m_ID < MAX_CLIENTS)
				{
					CSnapState::CCharacterInfo *pCharInfo = &m_Snap.m_aCharacters[Item.m_ID];
					const void *pOld = Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_CHARACTER, Item.m_ID);
					pCharInfo->m_Cur = *((const CNetObj_Character *)pData);

					// clamp ammo count for non ninja weapon
					if(pCharInfo->m_Cur.m_Weapon != WEAPON_NINJA)
						pCharInfo->m_Cur.m_AmmoCount = clamp(pCharInfo->m_Cur.m_AmmoCount, 0, 10);

					if(pOld)
					{
						pCharInfo->m_Active = true;
						pCharInfo->m_Prev = *((const CNetObj_Character *)pOld);

						// limit evolving to 3 seconds
						int EvolvePrevTick = minimum(pCharInfo->m_Prev.m_Tick + Client()->GameTickSpeed()*3, Client()->PrevGameTick());
						int EvolveCurTick = minimum(pCharInfo->m_Cur.m_Tick + Client()->GameTickSpeed()*3, Client()->GameTick());

						// reuse the evolved char
						if(m_aClients[Item.m_ID].m_Evolved.m_Tick == EvolvePrevTick)
						{
							pCharInfo->m_Prev = m_aClients[Item.m_ID].m_Evolved;
							if(mem_comp(pData, pOld, sizeof(CNetObj_Character)) == 0)
								pCharInfo->m_Cur = m_aClients[Item.m_ID].m_Evolved;
						}

						if(pCharInfo->m_Prev.m_Tick)
							EvolveCharacter(&pCharInfo->m_Prev, EvolvePrevTick);
						if(pCharInfo->m_Cur.m_Tick)
							EvolveCharacter(&pCharInfo->m_Cur, EvolveCurTick);
						
						m_aClients[Item.m_ID].m_Evolved = m_Snap.m_aCharacters[Item.m_ID].m_Cur;
					}

					if(Item.m_ID != m_LocalClientID || Client()->State() == IClient::STATE_DEMOPLAYBACK)
						ProcessTriggeredEvents(pCharInfo->m_Cur.m_TriggeredEvents, vec2(pCharInfo->m_Cur.m_X, pCharInfo->m_Cur.m_Y));
				}
			}
			else if(Item.m_Type == NETOBJTYPE_SPECTATORINFO)
			{
				m_Snap.m_pSpectatorInfo = (const CNetObj_SpectatorInfo *)pData;
				m_Snap.m_pPrevSpectatorInfo = (const CNetObj_SpectatorInfo *)Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_SPECTATORINFO, Item.m_ID);
				m_Snap.m_SpecInfo.m_Active = true;
				m_Snap.m_SpecInfo.m_SpecMode = m_Snap.m_pSpectatorInfo->m_SpecMode;
				m_Snap.m_SpecInfo.m_SpectatorID = m_Snap.m_pSpectatorInfo->m_SpectatorID;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATA)
			{
				m_Snap.m_pGameData = (const CNetObj_GameData *)pData;

				static int s_LastGameFlags = 0;
				int GameFlags = m_Snap.m_pGameData->m_GameStateFlags;
				if(!(s_LastGameFlags&GAMESTATEFLAG_GAMEOVER) && GameFlags&GAMESTATEFLAG_GAMEOVER)
					OnGameOver();
				else if(s_LastGameFlags&GAMESTATEFLAG_GAMEOVER && !(GameFlags&GAMESTATEFLAG_GAMEOVER))
					OnStartGame();

				// stats
				if(m_Snap.m_pGameData->m_GameStartTick != m_LastGameStartTick && !(s_LastGameFlags&GAMESTATEFLAG_ROUNDOVER)
					&& !(s_LastGameFlags&GAMESTATEFLAG_PAUSED) && (!(GameFlags&GAMESTATEFLAG_PAUSED) || GameFlags&GAMESTATEFLAG_STARTCOUNTDOWN))
				{
					m_pStats->OnMatchStart();
				}

				if(!(GameFlags&(GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
					m_pStats->UpdatePlayTime(Client()->GameTick() - Client()->PrevGameTick());

				s_LastGameFlags = GameFlags;
				m_LastGameStartTick = m_Snap.m_pGameData->m_GameStartTick;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATATEAM)
			{
				m_Snap.m_pGameDataTeam = (const CNetObj_GameDataTeam *)pData;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATAFLAG)
			{
				m_Snap.m_pGameDataFlag = (const CNetObj_GameDataFlag *)pData;
				m_Snap.m_GameDataFlagSnapID = Item.m_ID;

				// stats
				if(m_LastFlagCarrierRed == FLAG_ATSTAND && m_Snap.m_pGameDataFlag->m_FlagCarrierRed >= 0)
					m_pStats->OnFlagGrab(m_Snap.m_pGameDataFlag->m_FlagCarrierRed);
				else if(m_LastFlagCarrierBlue == FLAG_ATSTAND && m_Snap.m_pGameDataFlag->m_FlagCarrierBlue >= 0)
					m_pStats->OnFlagGrab(m_Snap.m_pGameDataFlag->m_FlagCarrierBlue);

				m_LastFlagCarrierRed = m_Snap.m_pGameDataFlag->m_FlagCarrierRed;
				m_LastFlagCarrierBlue = m_Snap.m_pGameDataFlag->m_FlagCarrierBlue;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATARACE)
			{
				m_Snap.m_pGameDataRace = (const CNetObj_GameDataRace *)pData;
			}
			else if(Item.m_Type == NETOBJTYPE_FLAG)
			{
				m_Snap.m_paFlags[Item.m_ID%2] = (const CNetObj_Flag *)pData;
			}
		}
	}

	// setup local pointers
	if(m_LocalClientID >= 0)
	{
		CSnapState::CCharacterInfo *c = &m_Snap.m_aCharacters[m_LocalClientID];
		if(c->m_Active)
		{
			if (!m_Snap.m_SpecInfo.m_Active)
			{
				m_Snap.m_pLocalCharacter = &c->m_Cur;
				m_Snap.m_pLocalPrevCharacter = &c->m_Prev;
				m_LocalCharacterPos = vec2(m_Snap.m_pLocalCharacter->m_X, m_Snap.m_pLocalCharacter->m_Y);
			}
		}
		else if(Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_CHARACTER, m_LocalClientID))
		{
			// player died
			m_pControls->OnPlayerDeath();
		}
	}
	else
	{
		m_Snap.m_SpecInfo.m_Active = true;
		if(Client()->State() == IClient::STATE_DEMOPLAYBACK && DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER &&
			m_DemoSpecID != -1 && m_Snap.m_aCharacters[m_DemoSpecID].m_Active)
		{
			m_Snap.m_SpecInfo.m_SpecMode = SPEC_PLAYER;
			m_Snap.m_SpecInfo.m_SpectatorID = m_DemoSpecID;
		}
		else
		{
			if (m_DemoSpecMode == SPEC_PLAYER)
			{
				m_Snap.m_SpecInfo.m_SpecMode = SPEC_FREEVIEW;
				m_Snap.m_SpecInfo.m_SpectatorID = -1;
			}
			else
			{
				m_Snap.m_SpecInfo.m_SpecMode = m_DemoSpecMode;
				m_Snap.m_SpecInfo.m_SpectatorID = m_DemoSpecID;
			}
		}
	}

	// sort player infos by score
	FCompareFunc Compare = (m_GameInfo.m_GameFlags&GAMEFLAG_RACE) ? CompareTime : CompareScore;

	for(int k = 0; k < MAX_CLIENTS-1; k++) // ffs, bubblesort
	{
		for(int i = 0; i < MAX_CLIENTS-k-1; i++)
		{
			if(m_Snap.m_aInfoByScore[i+1].m_pPlayerInfo && (!m_Snap.m_aInfoByScore[i].m_pPlayerInfo ||
				Compare(m_Snap.m_aInfoByScore[i].m_pPlayerInfo, m_Snap.m_aInfoByScore[i+1].m_pPlayerInfo)))
			{
				CPlayerInfoItem Tmp = m_Snap.m_aInfoByScore[i];
				m_Snap.m_aInfoByScore[i] = m_Snap.m_aInfoByScore[i+1];
				m_Snap.m_aInfoByScore[i+1] = Tmp;
			}
		}
	}

	// calc some player stats
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(!m_Snap.m_paPlayerInfos[i])
			continue;

		// count not ready players
		if(m_Snap.m_pGameData && (m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_STARTCOUNTDOWN|GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_WARMUP)) &&
			m_Snap.m_pGameData->m_GameStateEndTick == 0 && m_aClients[i].m_Team != TEAM_SPECTATORS && !(m_Snap.m_paPlayerInfos[i]->m_PlayerFlags&PLAYERFLAG_READY))
			m_Snap.m_NotReadyCount++;

		// count alive players per team
		if((m_GameInfo.m_GameFlags&GAMEFLAG_SURVIVAL) && m_aClients[i].m_Team != TEAM_SPECTATORS && !(m_Snap.m_paPlayerInfos[i]->m_PlayerFlags&PLAYERFLAG_DEAD))
			m_Snap.m_AliveCount[m_aClients[i].m_Team]++;
	}

	if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(m_aClients[i].m_Active)
				m_aClients[i].UpdateRenderInfo(this, i, true);
		}
	}

	CServerInfo CurrentServerInfo;
	Client()->GetServerInfo(&CurrentServerInfo);
	if(str_comp(CurrentServerInfo.m_aGameType, "DM") != 0 && str_comp(CurrentServerInfo.m_aGameType, "TDM") != 0 && str_comp(CurrentServerInfo.m_aGameType, "CTF") != 0 &&
		str_comp(CurrentServerInfo.m_aGameType, "LMS") != 0 && str_comp(CurrentServerInfo.m_aGameType, "LTS") != 0)
		m_ServerMode = SERVERMODE_MOD;
	else if(mem_comp(&StandardTuning, &m_Tuning, sizeof(CTuningParams)) == 0)
		m_ServerMode = SERVERMODE_PURE;
	else
		m_ServerMode = SERVERMODE_PUREMOD;
}